

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O3

stale_header_info fdb_get_smallest_active_header(fdb_kvs_handle *handle)

{
  avl_node **__lock;
  filemgr *pfVar1;
  long lVar2;
  long lVar3;
  bid_t bVar4;
  char *bid;
  undefined1 *buf;
  avl_node *paVar5;
  avl_node *paVar6;
  avl_node *paVar7;
  ulong uVar8;
  avl_node *paVar9;
  ulong uVar10;
  ulong uVar11;
  avl_node *paVar12;
  stale_header_info sVar13;
  long alStack_d0 [9];
  undefined1 auStack_88 [8];
  bid_t local_80;
  uint64_t dummy64;
  char *new_filename;
  bid_t last_wal_bid;
  avl_node *local_60;
  undefined1 *local_58;
  uint64_t local_50;
  filemgr_magic_t magic;
  fdb_seqnum_t seqnum;
  size_t hdr_len;
  
  lVar3 = -((ulong)(handle->config).blocksize + 0xf & 0xfffffffffffffff0);
  local_58 = auStack_88 + lVar3;
  paVar9 = (avl_node *)
           (handle->fhandle->root->cur_header_revnum).super___atomic_base<unsigned_long>._M_i;
  paVar12 = (avl_node *)
            (handle->fhandle->root->last_hdr_bid).super___atomic_base<unsigned_long>._M_i;
  pfVar1 = handle->file;
  *(undefined8 *)((long)alStack_d0 + lVar3 + 0x40) = 0x148f6e;
  pthread_spin_lock(&pfVar1->fhandle_idx_lock);
  pfVar1 = handle->file;
  last_wal_bid = (bid_t)handle;
  *(undefined8 *)((long)alStack_d0 + lVar3 + 0x40) = 0x148f80;
  paVar5 = avl_first(&pfVar1->fhandle_idx);
  local_60 = paVar9;
  bVar4 = last_wal_bid;
  while (last_wal_bid = bVar4, paVar5 != (avl_node *)0x0) {
    *(undefined8 *)((long)alStack_d0 + lVar3 + 0x40) = 0x148f97;
    paVar6 = avl_next(paVar5);
    paVar5 = paVar5[-1].right;
    __lock = &paVar5[1].left;
    *(undefined8 *)((long)alStack_d0 + lVar3 + 0x40) = 0x148faa;
    pthread_spin_lock((pthread_spinlock_t *)__lock);
    paVar5 = paVar5->left->parent;
    while (paVar7 = paVar5, paVar7 != (avl_node *)0x0) {
      paVar5 = paVar7->left;
      if ((paVar7[-1].right[0x11].right != (avl_node *)0x0) &&
         (paVar7[-1].right[0x10].parent < paVar9)) {
        paVar9 = paVar7[-1].right[0x10].parent;
        paVar12 = paVar7[-1].right[0x10].right;
      }
    }
    *(undefined8 *)((long)alStack_d0 + lVar3 + 0x40) = 0x148ff7;
    pthread_spin_unlock((pthread_spinlock_t *)__lock);
    paVar5 = paVar6;
    bVar4 = last_wal_bid;
  }
  lVar2 = *(long *)(bVar4 + 0x48);
  *(undefined8 *)((long)alStack_d0 + lVar3 + 0x40) = 0x14900e;
  pthread_spin_unlock((pthread_spinlock_t *)(lVar2 + 0x2e8));
  buf = local_58;
  uVar10 = *(ulong *)(*(long *)(*(long *)(bVar4 + 0x48) + 0x110) + 0x50);
  paVar5 = paVar12;
  if (uVar10 != 0) {
    if (paVar12 == *(avl_node **)(bVar4 + 400)) {
      paVar5 = *(avl_node **)(*(long *)(bVar4 + 0x48) + 0x68);
      paVar9 = (avl_node *)(*(long *)(*(long *)(bVar4 + 0x48) + 0x58) + -1);
    }
    hdr_len = (size_t)paVar9;
    uVar8 = (long)local_60 - (long)paVar9;
    uVar11 = 0;
    if (uVar8 <= uVar10) {
      uVar11 = uVar10 - uVar8;
    }
    if (uVar8 <= uVar10 && uVar10 - uVar8 != 0) {
      pfVar1 = *(filemgr **)(bVar4 + 0x48);
      local_60 = (avl_node *)(bVar4 + 0x168);
      *(avl_node **)((long)alStack_d0 + lVar3 + 0x40) = (avl_node *)(bVar4 + 0x168);
      *(undefined8 *)((long)alStack_d0 + lVar3 + 0x38) = 0;
      *(uint64_t **)((long)alStack_d0 + lVar3 + 0x30) = &local_50;
      *(undefined8 *)((long)alStack_d0 + lVar3 + 0x28) = 0;
      *(undefined8 *)((long)alStack_d0 + lVar3 + 0x20) = 0x149098;
      paVar9 = (avl_node *)
               filemgr_fetch_prev_header
                         (pfVar1,(uint64_t)paVar5,buf,&seqnum,&magic,&hdr_len,
                          *(uint64_t **)((long)alStack_d0 + lVar3 + 0x28),
                          *(uint64_t **)((long)alStack_d0 + lVar3 + 0x30),
                          *(uint64_t **)((long)alStack_d0 + lVar3 + 0x38),
                          *(err_log_callback **)((long)alStack_d0 + lVar3 + 0x40));
      paVar5 = paVar12;
      if (seqnum != 0) {
        uVar10 = 0;
        do {
          paVar5 = paVar9;
          uVar10 = uVar10 + 1;
          if (uVar11 <= uVar10) break;
          pfVar1 = *(filemgr **)(last_wal_bid + 0x48);
          *(avl_node **)((long)alStack_d0 + lVar3 + 0x40) = local_60;
          *(undefined8 *)((long)alStack_d0 + lVar3 + 0x38) = 0;
          *(uint64_t **)((long)alStack_d0 + lVar3 + 0x30) = &local_50;
          *(undefined8 *)((long)alStack_d0 + lVar3 + 0x28) = 0;
          *(undefined8 *)((long)alStack_d0 + lVar3 + 0x20) = 0x1490e1;
          paVar9 = (avl_node *)
                   filemgr_fetch_prev_header
                             (pfVar1,(uint64_t)paVar5,buf,&seqnum,&magic,&hdr_len,
                              *(uint64_t **)((long)alStack_d0 + lVar3 + 0x28),
                              *(uint64_t **)((long)alStack_d0 + lVar3 + 0x30),
                              *(uint64_t **)((long)alStack_d0 + lVar3 + 0x38),
                              *(err_log_callback **)((long)alStack_d0 + lVar3 + 0x40));
        } while (seqnum != 0);
      }
    }
  }
  bVar4 = last_wal_bid;
  pfVar1 = *(filemgr **)(last_wal_bid + 0x48);
  if (paVar5 == *(avl_node **)(last_wal_bid + 400)) {
    *(undefined8 *)((long)alStack_d0 + lVar3 + 0x40) = 0x149126;
    filemgr_get_header(pfVar1,buf,&seqnum,(bid_t *)0x0,&magic,&hdr_len);
    if (seqnum == 0) {
      new_filename = (char *)0xffffffffffffffff;
      hdr_len = 0;
      goto LAB_001491e9;
    }
  }
  else {
    *(bid_t *)((long)alStack_d0 + lVar3 + 0x40) = last_wal_bid + 0x168;
    *(undefined8 *)((long)alStack_d0 + lVar3 + 0x38) = 0;
    *(uint64_t **)((long)alStack_d0 + lVar3 + 0x30) = &local_50;
    *(undefined8 *)((long)alStack_d0 + lVar3 + 0x28) = 0;
    *(undefined8 *)((long)alStack_d0 + lVar3 + 0x20) = 0x149165;
    filemgr_fetch_header
              (pfVar1,(uint64_t)paVar5,buf,&seqnum,&magic,&hdr_len,
               *(uint64_t **)((long)alStack_d0 + lVar3 + 0x28),
               *(uint64_t **)((long)alStack_d0 + lVar3 + 0x30),
               *(uint64_t **)((long)alStack_d0 + lVar3 + 0x38),
               *(err_log_callback **)((long)alStack_d0 + lVar3 + 0x40));
  }
  *(undefined8 *)((long)alStack_d0 + lVar3 + 0x40) = 0;
  *(uint64_t **)((long)alStack_d0 + lVar3 + 0x38) = &dummy64;
  *(bid_t **)((long)alStack_d0 + lVar3 + 0x30) = &local_80;
  *(bid_t **)((long)alStack_d0 + lVar3 + 0x28) = &local_80;
  *(char ***)((long)alStack_d0 + lVar3 + 0x20) = &new_filename;
  *(bid_t **)((long)alStack_d0 + lVar3 + 0x18) = &local_80;
  *(bid_t **)((long)alStack_d0 + lVar3 + 0x10) = &local_80;
  *(bid_t **)((long)alStack_d0 + lVar3 + 8) = &local_80;
  *(undefined8 *)((long)alStack_d0 + lVar3) = 0x149196;
  fdb_fetch_header(local_50,buf,&local_80,&local_80,&local_80,&local_80,
                   *(uint64_t **)((long)alStack_d0 + lVar3 + 8),
                   *(uint64_t **)((long)alStack_d0 + lVar3 + 0x10),
                   *(uint64_t **)((long)alStack_d0 + lVar3 + 0x18),
                   *(uint64_t **)((long)alStack_d0 + lVar3 + 0x20),
                   *(uint64_t **)((long)alStack_d0 + lVar3 + 0x28),
                   *(uint64_t **)((long)alStack_d0 + lVar3 + 0x30),
                   *(char ***)((long)alStack_d0 + lVar3 + 0x38),
                   *(char ***)((long)alStack_d0 + lVar3 + 0x40));
  bid = new_filename;
  if (new_filename == (char *)0xffffffffffffffff) {
    new_filename = (char *)0xffffffffffffffff;
    hdr_len = 0;
  }
  else {
    pfVar1 = *(filemgr **)(bVar4 + 0x48);
    *(bid_t *)((long)alStack_d0 + lVar3 + 0x40) = bVar4 + 0x168;
    *(undefined8 *)((long)alStack_d0 + lVar3 + 0x38) = 0;
    *(uint64_t **)((long)alStack_d0 + lVar3 + 0x30) = &local_50;
    *(undefined8 *)((long)alStack_d0 + lVar3 + 0x28) = 0;
    *(undefined8 *)((long)alStack_d0 + lVar3 + 0x20) = 0x1491d2;
    filemgr_fetch_header
              (pfVar1,(uint64_t)bid,buf,&seqnum,&magic,&hdr_len,
               *(uint64_t **)((long)alStack_d0 + lVar3 + 0x28),
               *(uint64_t **)((long)alStack_d0 + lVar3 + 0x30),
               *(uint64_t **)((long)alStack_d0 + lVar3 + 0x38),
               *(err_log_callback **)((long)alStack_d0 + lVar3 + 0x40));
  }
LAB_001491e9:
  sVar13.bid = (bid_t)new_filename;
  sVar13.revnum = hdr_len;
  return sVar13;
}

Assistant:

stale_header_info fdb_get_smallest_active_header(fdb_kvs_handle *handle)
{
    uint8_t *hdr_buf = alca(uint8_t, handle->config.blocksize);
    size_t i, hdr_len;
    uint64_t n_headers;
    bid_t hdr_bid, last_wal_bid;
    filemgr_header_revnum_t hdr_revnum;
    filemgr_header_revnum_t cur_revnum;
    filemgr_magic_t magic;
    fdb_seqnum_t seqnum;
    fdb_file_handle *fhandle = NULL;
    stale_header_info ret;
    struct avl_node *a;
    struct filemgr_fhandle_idx_node *fhandle_node;
    struct list_elem *e;
    struct kvs_opened_node *item;

    ret.revnum = cur_revnum = handle->fhandle->root->cur_header_revnum;
    ret.bid = handle->fhandle->root->last_hdr_bid;

    spin_lock(&handle->file->fhandle_idx_lock);

    // check all opened file handles
    a = avl_first(&handle->file->fhandle_idx);
    while (a) {
        fhandle_node = _get_entry(a, struct filemgr_fhandle_idx_node, avl);
        a = avl_next(a);

        fhandle = (fdb_file_handle*)fhandle_node->fhandle;
        spin_lock(&fhandle->lock);
        // check all opened KVS handles belonging to the file handle
        e = list_begin(fhandle->handles);
        while (e) {

            item = _get_entry(e, struct kvs_opened_node, le);
            e = list_next(e);

            if (!item->handle->shandle) {
                // Only consider active snapshot handles since non-snapshot
                // handles will get synced upon their next forestdb api call.
                // This prevents "lazy" non-snapshot handles from holding up
                // stale block reclaim.
                continue;
            }

            if (item->handle->cur_header_revnum < ret.revnum) {
                ret.revnum = item->handle->cur_header_revnum;
                ret.bid = item->handle->last_hdr_bid;
            }
        }
        spin_unlock(&fhandle->lock);
    }

    spin_unlock(&handle->file->fhandle_idx_lock);

    uint64_t num_keeping_headers =
        atomic_get_uint64_t(&handle->file->config->num_keeping_headers,
                            std::memory_order_relaxed);
    if (num_keeping_headers) {
        // backward scan previous header info to keep more headers

        if (ret.bid == handle->last_hdr_bid) {
            // header in 'handle->last_hdr_bid' is not written into file yet!
            // we should start from the previous header
            hdr_bid = atomic_get_uint64_t(&handle->file->header.bid);
            hdr_revnum = handle->file->header.revnum - 1;
        } else {
            hdr_bid = ret.bid;
            hdr_revnum = ret.revnum;
        }

        n_headers= num_keeping_headers;
        if (cur_revnum - hdr_revnum < n_headers) {
            n_headers = n_headers - (cur_revnum - hdr_revnum);
        } else {
            n_headers = 0;
        }

        for (i=0; i<n_headers; ++i) {
            hdr_bid = filemgr_fetch_prev_header(handle->file, hdr_bid,
                         hdr_buf, &hdr_len, &seqnum, &hdr_revnum, NULL,
                         &magic, NULL, &handle->log_callback);
            if (hdr_len) {
                ret.revnum = hdr_revnum;
                ret.bid = hdr_bid;
            } else {
                break;
            }
        }
        if (!n_headers) {
            ret.bid = hdr_bid;
            ret.revnum = hdr_revnum;
        }
    }

    // although we keep more headers from the oldest active header, we have to
    // preserve the last WAL flushing header from the target header for data
    // consistency.
    uint64_t dummy64;
    char *new_filename;

    if (ret.bid == handle->last_hdr_bid) {
        // The latest header (that is not written yet) is the
        // only one that we can reclaim. Read from memory.
        filemgr_get_header(handle->file, hdr_buf, &hdr_len, NULL, &seqnum, &hdr_revnum);
        if (!hdr_len) {
            ret.bid = BLK_NOT_FOUND;
            ret.revnum = 0;
            return ret;
        }
    } else {
        filemgr_fetch_header(handle->file, ret.bid, hdr_buf, &hdr_len, &seqnum,
                             &hdr_revnum, NULL, &magic, NULL, &handle->log_callback);
    }
    fdb_fetch_header(magic, hdr_buf, &dummy64, &dummy64, &dummy64, &dummy64,
                     &dummy64, &dummy64, &dummy64, &last_wal_bid, &dummy64,
                     &dummy64, &new_filename, NULL);

    if (last_wal_bid != BLK_NOT_FOUND) {
        filemgr_fetch_header(handle->file, last_wal_bid, hdr_buf, &hdr_len, &seqnum,
                             &hdr_revnum, NULL, &magic, NULL, &handle->log_callback);
        ret.bid = last_wal_bid;
        ret.revnum = hdr_revnum;
    } else {
        // WAL has not been flushed yet .. we cannot trigger block reusing
        ret.bid = BLK_NOT_FOUND;
        ret.revnum = 0;
    }

    return ret;
}